

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

void Gia_Iso2ManCheckIsoClassOne
               (Gia_Man_t *p,Vec_Int_t *vClass,Vec_Int_t *vRoots,Vec_Int_t *vVec0,Vec_Int_t *vVec1,
               Vec_Int_t *vMap0,Vec_Int_t *vMap1,Vec_Int_t *vNewClass)

{
  int Entry;
  int iVar1;
  int i;
  int iPo;
  ulong local_60;
  Gia_Man_t *local_58;
  Vec_Int_t *local_50;
  Vec_Int_t *local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  local_50 = vMap1;
  local_40 = vNewClass;
  vNewClass->nSize = 0;
  if (vClass->nSize < 2) {
    return;
  }
  iPo = Vec_IntEntry(vClass,0);
  i = 1;
  local_58 = p;
  local_38 = vRoots;
  Gia_Iso2ManCollectOrder(p,&iPo,1,vRoots,vVec0,vMap0);
  local_60 = 1;
  local_48 = vVec0;
  do {
    if (vClass->nSize <= i) {
      Vec_IntShrink(vClass,(int)local_60);
      return;
    }
    Entry = Vec_IntEntry(vClass,i);
    iPo = Entry;
    Gia_Iso2ManCollectOrder(local_58,&iPo,1,local_38,vVec1,local_50);
    if (vVec0->nSize == vVec1->nSize) {
      iVar1 = Gia_Iso2ManCheckIsoPair(local_58,vVec0,vVec1,vMap0,local_50);
      if (iVar1 == 0) goto LAB_005e2625;
      iVar1 = (int)local_60;
      Vec_IntWriteEntry(vClass,iVar1,Entry);
      local_60 = (ulong)(iVar1 + 1);
      vVec0 = local_48;
    }
    else {
LAB_005e2625:
      Vec_IntPush(local_40,Entry);
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Gia_Iso2ManCheckIsoClassOne( Gia_Man_t * p, Vec_Int_t * vClass, Vec_Int_t * vRoots, Vec_Int_t * vVec0, Vec_Int_t * vVec1, Vec_Int_t * vMap0, Vec_Int_t * vMap1, Vec_Int_t * vNewClass )
{
    int i, k = 1, iPo;
    Vec_IntClear( vNewClass );
    if ( Vec_IntSize(vClass) <= 1 )
        return;
    assert( Vec_IntSize(vClass) > 1 );
    iPo = Vec_IntEntry( vClass, 0 );
    Gia_Iso2ManCollectOrder( p, &iPo, 1, vRoots, vVec0, vMap0 );
    Vec_IntForEachEntryStart( vClass, iPo, i, 1 )
    {
        Gia_Iso2ManCollectOrder( p, &iPo, 1, vRoots, vVec1, vMap1 );
        if ( Vec_IntSize(vVec0) == Vec_IntSize(vVec1) && Gia_Iso2ManCheckIsoPair(p, vVec0, vVec1, vMap0, vMap1) )
            Vec_IntWriteEntry( vClass, k++, iPo );
        else
            Vec_IntPush( vNewClass, iPo );
    }
    Vec_IntShrink( vClass, k );
}